

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__bmp_test_raw(stbi__context *s)

{
  stbi_uc sVar1;
  stbi__uint32 sVar2;
  int sz;
  int r;
  stbi__context *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool bVar3;
  undefined4 local_4;
  
  sVar1 = stbi__get8(in_stack_ffffffffffffffd8);
  if (sVar1 == 'B') {
    sVar1 = stbi__get8(in_stack_ffffffffffffffd8);
    if (sVar1 == 'M') {
      stbi__get32le((stbi__context *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      stbi__get16le((stbi__context *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      stbi__get16le((stbi__context *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      stbi__get32le((stbi__context *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      sVar2 = stbi__get32le((stbi__context *)
                            CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      bVar3 = true;
      if ((((sVar2 != 0xc) && (bVar3 = true, sVar2 != 0x28)) && (bVar3 = true, sVar2 != 0x38)) &&
         (bVar3 = true, sVar2 != 0x6c)) {
        bVar3 = sVar2 == 0x7c;
      }
      local_4 = (uint)bVar3;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int stbi__bmp_test_raw(stbi__context *s)
{
   int r;
   int sz;
   if (stbi__get8(s) != 'B') return 0;
   if (stbi__get8(s) != 'M') return 0;
   stbi__get32le(s); // discard filesize
   stbi__get16le(s); // discard reserved
   stbi__get16le(s); // discard reserved
   stbi__get32le(s); // discard data offset
   sz = stbi__get32le(s);
   r = (sz == 12 || sz == 40 || sz == 56 || sz == 108 || sz == 124);
   return r;
}